

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O3

void scp_source_send_CD(ScpSource *scp,char cmdchar,fxp_attrs attrs,uint64_t size,ptrlen name)

{
  int iVar1;
  void *pvVar2;
  uint uVar3;
  strbuf *psVar4;
  void *pvVar5;
  size_t __n;
  void *__s;
  
  __n = name.len;
  if (scp->n_pending_commands != 0) {
    __assert_fail("scp->n_pending_commands == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/scpserver.c"
                  ,0x224,
                  "void scp_source_send_CD(ScpSource *, char, struct fxp_attrs, uint64_t, ptrlen)");
  }
  if ((scp->send_file_times == true) &&
     (((undefined1  [56])attrs & (undefined1  [56])0x8) != (undefined1  [56])0x0)) {
    psVar4 = strbuf_new();
    iVar1 = scp->n_pending_commands;
    scp->n_pending_commands = iVar1 + 1;
    scp->pending_commands[iVar1] = psVar4;
    BinarySink_put_fmt(psVar4->binarysink_,"T%lu 0 %lu 0\n",attrs.mtime,attrs.atime);
  }
  pvVar5 = memchr(name.ptr,0x2f,__n);
  pvVar2 = name.ptr;
  while (pvVar5 != (void *)0x0) {
    __s = (void *)((long)pvVar5 + 1);
    __n = (long)pvVar2 + (__n - (long)__s);
    pvVar5 = memchr(__s,0x2f,__n);
    pvVar2 = __s;
  }
  psVar4 = strbuf_new();
  iVar1 = scp->n_pending_commands;
  scp->n_pending_commands = iVar1 + 1;
  scp->pending_commands[iVar1] = psVar4;
  uVar3 = string_length_for_printf(__n);
  BinarySink_put_fmt(psVar4->binarysink_,"%c%04o %lu %.*s\n",(ulong)(byte)cmdchar,
                     (ulong)((uint)attrs.permissions & 0xfff),size,(ulong)uVar3,pvVar2);
  if (cmdchar == 'C') {
    psVar4 = strbuf_new();
    iVar1 = scp->n_pending_commands;
    scp->n_pending_commands = iVar1 + 1;
    scp->pending_commands[iVar1] = psVar4;
  }
  return;
}

Assistant:

static void scp_source_send_CD(
    ScpSource *scp, char cmdchar,
    struct fxp_attrs attrs, uint64_t size, ptrlen name)
{
    strbuf *cmd;

    assert(scp->n_pending_commands == 0);

    if (scp->send_file_times && (attrs.flags & SSH_FILEXFER_ATTR_ACMODTIME)) {
        scp->pending_commands[scp->n_pending_commands++] = cmd = strbuf_new();
        /* Our SFTP-based filesystem API doesn't support microsecond times */
        put_fmt(cmd, "T%lu 0 %lu 0\012", attrs.mtime, attrs.atime);
    }

    const char *slash;
    while ((slash = memchr(name.ptr, '/', name.len)) != NULL)
        name = make_ptrlen(
            slash+1, name.len - (slash+1 - (const char *)name.ptr));

    scp->pending_commands[scp->n_pending_commands++] = cmd = strbuf_new();
    put_fmt(cmd, "%c%04o %"PRIu64" %.*s\012", cmdchar,
            (unsigned)(attrs.permissions & 07777),
            size, PTRLEN_PRINTF(name));

    if (cmdchar == 'C') {
        /* We'll also wait for an ack before sending the file data,
         * which we record by saving a zero-length 'command' to be
         * sent after the C. */
        scp->pending_commands[scp->n_pending_commands++] = cmd = strbuf_new();
    }
}